

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O0

void __thiscall
Kernel::DisagreementSetIterator::reset
          (DisagreementSetIterator *this,TermList t1,TermList t2,bool disjunctVariables)

{
  bool bVar1;
  uint uVar2;
  TermList TVar3;
  Term *pTVar4;
  Stack<Kernel::TermList_*> *this_00;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  TermList *in_stack_ffffffffffffffa8;
  TermList in_stack_ffffffffffffffb0;
  TermList in_stack_ffffffffffffffb8;
  
  Lib::Stack<Kernel::TermList_*>::reset((Stack<Kernel::TermList_*> *)(in_RDI + 0x10));
  *(byte *)(in_RDI + 0x30) = in_CL & 1;
  bVar1 = TermList::sameTop(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if ((!bVar1) ||
     ((bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffffb0._content), bVar1 &&
      ((in_CL & 1) != 0)))) {
    *(undefined8 *)(in_RDI + 0x38) = in_RSI;
    *(undefined8 *)(in_RDI + 0x40) = in_RDX;
  }
  else {
    TVar3 = TermList::empty();
    *(uint64_t *)(in_RDI + 0x38) = TVar3._content;
    bVar1 = TermList::isTerm((TermList *)0x33a60e);
    if (bVar1) {
      pTVar4 = TermList::term((TermList *)0x33a61e);
      uVar2 = Term::arity(pTVar4);
      if (uVar2 != 0) {
        this_00 = (Stack<Kernel::TermList_*> *)(in_RDI + 0x10);
        pTVar4 = TermList::term((TermList *)0x33a643);
        Term::args(pTVar4);
        Lib::Stack<Kernel::TermList_*>::push(this_00,in_stack_ffffffffffffffa8);
        pTVar4 = TermList::term((TermList *)0x33a670);
        Term::args(pTVar4);
        Lib::Stack<Kernel::TermList_*>::push(this_00,in_stack_ffffffffffffffa8);
      }
    }
  }
  return;
}

Assistant:

void reset(TermList t1, TermList t2, bool disjunctVariables=true)
  {
    ASS(!t1.isEmpty());
    ASS(!t2.isEmpty());

    _stack.reset();
    _disjunctVariables=disjunctVariables;
    if(!TermList::sameTop(t1,t2) || (t1.isVar() && disjunctVariables)) {
      _arg1=t1;
      _arg2=t2;
      return;
    }
    _arg1 = TermList::empty();
    if(t1.isTerm() && t1.term()->arity()>0) {
      _stack.push(t1.term()->args());
      _stack.push(t2.term()->args());
    }
  }